

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
* __thiscall
dg::llvmdg::legacy::Function::condNodes
          (set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           *__return_storage_ptr__,Function *this)

{
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *psVar1;
  iterator iVar2;
  const_iterator __position;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Alloc_node local_30;
  
  __position._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->blocks)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      psVar1 = Block::successors(*(Block **)(p_Var3 + 1));
      if (1 < (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
        local_30._M_t = &__return_storage_ptr__->_M_t;
        iVar2 = std::
                _Rb_tree<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::_Identity<dg::llvmdg::legacy::Block*>,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>
                ::
                _M_insert_unique_<dg::llvmdg::legacy::Block*const&,std::_Rb_tree<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::_Identity<dg::llvmdg::legacy::Block*>,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>::_Alloc_node>
                          ((_Rb_tree<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::_Identity<dg::llvmdg::legacy::Block*>,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>
                            *)__return_storage_ptr__,__position,(Block **)(p_Var3 + 1),&local_30);
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Block *> Function::condNodes() const {
    std::set<Block *> condNodes_;

    std::copy_if(
            blocks.begin(), blocks.end(),
            std::inserter(condNodes_, condNodes_.end()),
            [](const Block *block) { return block->successors().size() > 1; });

    return condNodes_;
}